

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O1

void __thiscall
duckdb::CreateARTIndexLocalSinkState::CreateARTIndexLocalSinkState
          (CreateARTIndexLocalSinkState *this,ClientContext *context)

{
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar1;
  vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> *pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  Allocator *allocator;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar1 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (undefined1  [16])0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__CreateARTIndexLocalSinkState_024a9d40;
  allocator = Allocator::Get(context);
  ArenaAllocator::ArenaAllocator(&this->arena_allocator,allocator,0x800);
  DataChunk::DataChunk(&this->key_chunk);
  pvVar3 = &(this->key_column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->keys).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
    super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar2 = &(this->keys).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>;
  (pvVar2->super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataChunk::DataChunk(&this->row_id_chunk);
  pvVar2 = &(this->row_ids).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>;
  (pvVar2->super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ids).super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
  super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit CreateARTIndexLocalSinkState(ClientContext &context) : arena_allocator(Allocator::Get(context)) {}